

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O0

void do_mon_spell(wchar_t index,monster *mon,_Bool seen)

{
  effect *effect;
  bool bVar1;
  player *p;
  wchar_t wVar2;
  monster_conflict *pmVar3;
  source sVar4;
  source origin;
  monster_spell_level *local_38;
  monster_spell_level *level;
  wchar_t target_midx;
  _Bool hits;
  _Bool ident;
  monster_spell *spell;
  monster *pmStack_18;
  _Bool seen_local;
  monster *mon_local;
  wchar_t index_local;
  
  spell._7_1_ = seen;
  pmStack_18 = mon;
  mon_local._4_4_ = index;
  _target_midx = monster_spell_by_index(index);
  p = player;
  level._7_1_ = 0;
  level._0_4_ = (pmStack_18->target).midx;
  if (_target_midx->hit == L'd') {
    level._6_1_ = true;
  }
  else if (_target_midx->hit == L'\0') {
    level._6_1_ = false;
  }
  else if ((wchar_t)level < L'\x01') {
    wVar2 = chance_of_spell_hit(pmStack_18,_target_midx);
    level._6_1_ = check_hit(p,wVar2);
  }
  else {
    wVar2 = chance_of_spell_hit(pmStack_18,_target_midx);
    pmVar3 = cave_monster(cave,(wchar_t)level);
    level._6_1_ = test_hit(wVar2,pmVar3->race->ac);
  }
  disturb(player);
  spell_message(pmStack_18,_target_midx,(_Bool)(spell._7_1_ & 1),(_Bool)(level._6_1_ & 1));
  if ((level._6_1_ & 1) != 0) {
    local_38 = _target_midx->level;
    while( true ) {
      bVar1 = false;
      if (local_38->next != (monster_spell_level *)0x0) {
        bVar1 = local_38->next->power <= pmStack_18->race->spell_power;
      }
      if (!bVar1) break;
      local_38 = local_38->next;
    }
    if (((local_38->save_message == (char *)0x0) || (L'\0' < (wchar_t)level)) ||
       (wVar2 = Rand_div(100), (player->state).skills[3] <= wVar2)) {
      effect = _target_midx->effect;
      sVar4 = source_monster(pmStack_18->midx);
      origin.which = sVar4.which;
      origin._4_4_ = 0;
      origin.what = sVar4.what;
      effect_do(effect,origin,(object *)0x0,(_Bool *)((long)&level + 7),true,L'\0',L'\0',L'\0',
                (command_conflict *)0x0);
    }
    else {
      msg("%s",local_38->save_message);
      spell_check_for_fail_rune(_target_midx);
    }
  }
  return;
}

Assistant:

void do_mon_spell(int index, struct monster *mon, bool seen)
{
	const struct monster_spell *spell = monster_spell_by_index(index);

	bool ident = false;
	bool hits;
	int target_midx = mon->target.midx;

	/* See if it hits */
	if (spell->hit == 100) {
		hits = true;
	} else if (spell->hit == 0) {
		hits = false;
	} else {
		if (target_midx > 0) {
			hits = test_hit(chance_of_spell_hit(mon, spell),
				cave_monster(cave, target_midx)->race->ac);
		} else {
			hits = check_hit(player, chance_of_spell_hit(mon, spell));
		}
	}

	/* Tell the player what's going on */
	disturb(player);
	spell_message(mon, spell, seen, hits);

	if (hits) {
		struct monster_spell_level *level = spell->level;

		/* Get the right level of save message */
		while (level->next && mon->race->spell_power >= level->next->power) {
			level = level->next;
		}

		/* Try a saving throw if available */
		if (level->save_message && (target_midx <= 0) &&
				randint0(100) < player->state.skills[SKILL_SAVE]) {
			msg("%s", level->save_message);
			spell_check_for_fail_rune(spell);
		} else {
			effect_do(spell->effect, source_monster(mon->midx), NULL, &ident, true, 0, 0, 0, NULL);
		}
	}
}